

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O0

void __thiscall GameTitle::wipeTitle(GameTitle *this,Screen *screen,int color1,int color2)

{
  allocator local_79;
  string local_78 [8];
  string letter;
  allocator local_41;
  string local_40 [8];
  string blank;
  int color2_local;
  int color1_local;
  Screen *screen_local;
  GameTitle *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40," ",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void GameTitle::wipeTitle(Screen &screen, int color1, int color2) {
    std::string blank = " ";
    std::string letter = "";

    // TODO: Write the rest of this function

}